

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ClassStatement(SQCompiler *this)

{
  SQInteger SVar1;
  SQCompiler *in_RDI;
  SQExpState es;
  SQCompiler *in_stack_000000a0;
  SQCompiler *in_stack_ffffffffffffffe0;
  SQInteger SVar2;
  SQFuncState *this_00;
  
  Lex(in_stack_ffffffffffffffe0);
  SVar2 = (in_RDI->_es).etype;
  SVar1 = (in_RDI->_es).epos;
  this_00 = *(SQFuncState **)&(in_RDI->_es).donot_get;
  (in_RDI->_es).donot_get = true;
  PrefixedExpr(in_stack_000000a0);
  if ((in_RDI->_es).etype == 1) {
    Error(in_RDI,"invalid class name");
  }
  else if (((in_RDI->_es).etype == 2) || ((in_RDI->_es).etype == 3)) {
    ClassExp((SQCompiler *)es.epos);
    EmitDerefOp((SQCompiler *)es.epos,es.etype._4_4_);
    SQFuncState::PopTarget(this_00);
  }
  else {
    Error(in_RDI,"cannot create a class in a local with the syntax(class <local>)");
  }
  (in_RDI->_es).etype = SVar2;
  (in_RDI->_es).epos = SVar1;
  *(SQFuncState **)&(in_RDI->_es).donot_get = this_00;
  return;
}

Assistant:

void ClassStatement()
    {
        SQExpState es;
        Lex();
        es = _es;
        _es.donot_get = true;
        PrefixedExpr();
        if(_es.etype == EXPR) {
            Error(_SC("invalid class name"));
        }
        else if(_es.etype == OBJECT || _es.etype == BASE) {
            ClassExp();
            EmitDerefOp(_OP_NEWSLOT);
            _fs->PopTarget();
        }
        else {
            Error(_SC("cannot create a class in a local with the syntax(class <local>)"));
        }
        _es = es;
    }